

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextobject.cpp
# Opt level: O3

void __thiscall QTextBlock::setUserData(QTextBlock *this,QTextBlockUserData *data)

{
  QTextBlockUserData *pQVar1;
  long *plVar2;
  
  if ((this->p != (QTextDocumentPrivate *)0x0) && ((ulong)(uint)this->n != 0)) {
    plVar2 = (long *)((long)(this->p->blocks).data.field_0.head + (ulong)(uint)this->n * 0x48 + 0x38
                     );
    pQVar1 = (QTextBlockUserData *)*plVar2;
    if (pQVar1 != (QTextBlockUserData *)0x0 && pQVar1 != data) {
      (*pQVar1->_vptr_QTextBlockUserData[1])();
    }
    *plVar2 = (long)data;
  }
  return;
}

Assistant:

void QTextBlock::setUserData(QTextBlockUserData *data)
{
    if (!p || !n)
        return;

    const QTextBlockData *b = p->blockMap().fragment(n);
    if (data != b->userData)
        delete b->userData;
    b->userData = data;
}